

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CloseSavepoints(sqlite3 *db)

{
  sqlite3 *db_00;
  long in_RDI;
  Savepoint *pTmp;
  void *in_stack_ffffffffffffffe8;
  
  while (*(long *)(in_RDI + 0x2d8) != 0) {
    db_00 = *(sqlite3 **)(in_RDI + 0x2d8);
    *(sqlite3_mutex **)(in_RDI + 0x2d8) = db_00->mutex;
    sqlite3DbFree(db_00,in_stack_ffffffffffffffe8);
  }
  *(undefined4 *)(in_RDI + 0x2e8) = 0;
  *(undefined4 *)(in_RDI + 0x2ec) = 0;
  *(undefined1 *)(in_RDI + 0x6d) = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CloseSavepoints(sqlite3 *db){
  while( db->pSavepoint ){
    Savepoint *pTmp = db->pSavepoint;
    db->pSavepoint = pTmp->pNext;
    sqlite3DbFree(db, pTmp);
  }
  db->nSavepoint = 0;
  db->nStatement = 0;
  db->isTransactionSavepoint = 0;
}